

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

void add_region(level *lev,region *reg)

{
  char cVar1;
  int iVar2;
  region **__src;
  monst *mon;
  bool bVar3;
  boolean bVar4;
  byte bVar5;
  uint uVar6;
  region **__dest;
  uint y;
  ulong local_48;
  
  uVar6 = lev->max_regions;
  if ((int)uVar6 <= lev->n_regions) {
    __src = lev->regions;
    __dest = (region **)malloc((long)(int)uVar6 * 8 + 0x50);
    lev->regions = __dest;
    if (0 < (int)uVar6) {
      memcpy(__dest,__src,(ulong)uVar6 << 3);
      free(__src);
    }
    lev->max_regions = lev->max_regions + 10;
  }
  reg->lev = lev;
  iVar2 = lev->n_regions;
  lev->regions[iVar2] = reg;
  lev->n_regions = iVar2 + 1;
  cVar1 = (reg->bounding_box).lx;
  uVar6 = (uint)cVar1;
  if (cVar1 <= (reg->bounding_box).hx) {
    do {
      local_48 = (ulong)uVar6;
      cVar1 = (reg->bounding_box).ly;
      if (cVar1 <= (reg->bounding_box).hy) {
        y = (int)cVar1;
        do {
          if (y < 0x15 && uVar6 - 1 < 0x4f) {
            mon = lev->monsters[local_48][y];
            if (((mon != (monst *)0x0) && ((mon->field_0x61 & 2) == 0)) &&
               (bVar4 = inside_region(reg,uVar6,y), bVar4 != '\0')) {
              add_mon_to_reg(reg,mon);
            }
            if ((reg->visible != '\0') && ((viz_array[y][local_48] & 2U) != 0)) {
              newsym(uVar6,y);
            }
          }
          bVar3 = (int)y < (int)(reg->bounding_box).hy;
          y = y + 1;
        } while (bVar3);
      }
      bVar3 = (int)uVar6 < (int)(reg->bounding_box).hx;
      uVar6 = uVar6 + 1;
    } while (bVar3);
  }
  bVar5 = inside_region(reg,(int)u.ux,(int)u.uy);
  reg->player_flags = reg->player_flags & 0xfeU | bVar5;
  return;
}

Assistant:

void add_region(struct level *lev, struct region *reg)
{
    struct region **tmp_reg;
    int i, j;

    if (lev->max_regions <= lev->n_regions) {
	tmp_reg = lev->regions;
	lev->regions = malloc(sizeof (struct region *) * (lev->max_regions + 10));
	if (lev->max_regions > 0) {
	    memcpy(lev->regions, tmp_reg,
			  lev->max_regions * sizeof (struct region *));
	    free(tmp_reg);
	}
	lev->max_regions += 10;
    }
    reg->lev = lev;
    lev->regions[lev->n_regions] = reg;
    lev->n_regions++;
    /* Check for monsters inside the region */
    for (i = reg->bounding_box.lx; i <= reg->bounding_box.hx; i++)
	for (j = reg->bounding_box.ly; j <= reg->bounding_box.hy; j++) {
	    /* Some lev->regions can cross the level boundaries */
	    if (!isok(i,j))
		continue;
	    if (MON_AT(lev, i, j) && inside_region(reg, i, j))
		add_mon_to_reg(reg, lev->monsters[i][j]);
	    if (reg->visible && cansee(i, j))
		newsym(i, j);
	}
    /* Check for player now... */
    if (inside_region(reg, u.ux, u.uy))
	set_hero_inside(reg);
    else
	clear_hero_inside(reg);
}